

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::shortRangeInteractions(ForceManager *this)

{
  double dVar1;
  double dVar2;
  RealType RVar3;
  bool bVar4;
  double *pdVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  SnapshotManager *this_00;
  Snapshot *this_01;
  long in_RDI;
  RealType RVar9;
  pair<std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_bool> pVar10;
  pair<std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_bool>
  pVar11;
  Snapshot *curSnapshot;
  InversionDataSet dataSet_2;
  iterator i_2;
  RealType currInversionPot;
  RealType angle_2;
  TorsionDataSet dataSet_1;
  iterator i_1;
  RealType currTorsionPot;
  RealType angle_1;
  BendDataSet dataSet;
  iterator i;
  RealType currBendPot;
  RealType angle;
  potVec selectionPotential;
  RealType inversionPotential;
  RealType torsionPotential;
  RealType bendPotential;
  RealType bondPotential;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  MoleculeIterator mi;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Molecule *mol;
  StuntDouble *in_stack_fffffffffffffc18;
  SelectionManager *in_stack_fffffffffffffc20;
  value_type *in_stack_fffffffffffffc28;
  Vector<double,_7U> *in_stack_fffffffffffffc30;
  iterator *in_stack_fffffffffffffc38;
  SimInfo *in_stack_fffffffffffffc40;
  long in_stack_fffffffffffffcf8;
  Bond *in_stack_fffffffffffffd00;
  RigidBody *in_stack_fffffffffffffdb0;
  _Self local_1f8;
  _Self local_1f0;
  RealType local_1e8;
  RealType local_1e0;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  undefined8 local_198;
  RealType local_190;
  RealType local_188;
  RealType local_180;
  RealType local_178;
  _Self local_170;
  _Self local_168;
  RealType local_160;
  RealType local_158;
  _Base_ptr local_150;
  undefined1 local_148;
  undefined8 local_110;
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  RealType local_f0;
  _Self local_e8;
  _Self local_e0;
  RealType local_d8;
  RealType local_d0;
  double local_c8;
  Vector<double,_7U> local_c0;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_68;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_60;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_58;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_50;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_40;
  Inversion *local_38;
  Torsion *local_30;
  Bend *local_28;
  Bond *local_20;
  RigidBody *local_18;
  Molecule *local_10;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_60);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_68);
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = 0.0;
  local_88 = 0.0;
  local_c8 = 0.0;
  Vector<double,_7U>::Vector(&local_c0,&local_c8);
  local_10 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffc40,(MoleculeIterator *)in_stack_fffffffffffffc38);
  do {
    if (local_10 == (Molecule *)0x0) {
      this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
      this_01 = SnapshotManager::getCurrentSnapshot(this_00);
      (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))(*(long **)(in_RDI + 0x30),this_01);
      Snapshot::setBondPotential(this_01,local_70);
      Snapshot::setBendPotential(this_01,local_78);
      Snapshot::setTorsionPotential(this_01,local_80);
      Snapshot::setInversionPotential(this_01,local_88);
      Vector<double,_7U>::Vector
                (in_stack_fffffffffffffc30,(Vector<double,_7U> *)in_stack_fffffffffffffc28);
      Snapshot::setSelectionPotentials(this_01,(potVec *)in_stack_fffffffffffffc18);
      return;
    }
    local_18 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    while (local_18 != (RigidBody *)0x0) {
      RigidBody::updateAtoms(in_stack_fffffffffffffdb0);
      local_18 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    }
    local_20 = Molecule::beginBond((Molecule *)in_stack_fffffffffffffc40,
                                   (iterator *)in_stack_fffffffffffffc38);
    while (local_20 != (Bond *)0x0) {
      Bond::calcForce(in_stack_fffffffffffffd00,SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x38,0));
      RVar9 = Bond::getPotential(local_20);
      local_70 = RVar9 + local_70;
      if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
        Bond::getAtomA((Bond *)0x311052);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        if (!bVar4) {
          Bond::getAtomB((Bond *)0x311089);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          if (!bVar4) goto LAB_003110da;
        }
        RVar9 = Bond::getPotential(local_20);
        pdVar5 = Vector<double,_7U>::operator[](&local_c0,6);
        *pdVar5 = RVar9 + *pdVar5;
      }
LAB_003110da:
      local_20 = Molecule::nextBond((Molecule *)in_stack_fffffffffffffc40,
                                    (iterator *)in_stack_fffffffffffffc38);
    }
    local_28 = Molecule::beginBend((Molecule *)in_stack_fffffffffffffc40,
                                   (iterator *)in_stack_fffffffffffffc38);
    while (local_28 != (Bend *)0x0) {
      (*(local_28->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (local_28,&local_d0,(ulong)*(byte *)(in_RDI + 9) & 1);
      local_d8 = Bend::getPotential(local_28);
      RVar9 = Bend::getPotential(local_28);
      local_78 = RVar9 + local_78;
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
           ::find((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                   *)in_stack_fffffffffffffc18,(key_type *)0x3111a2);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
           ::end((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                  *)in_stack_fffffffffffffc18);
      bVar4 = std::operator==(&local_e0,&local_e8);
      if (bVar4) {
        local_f8 = local_d0;
        local_108 = local_d0;
        local_f0 = local_d8;
        local_100 = local_d8;
        local_110 = 0;
        std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>::
        pair<OpenMD::Bend_*&,_OpenMD::BendDataSet_&,_true>
                  ((pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)in_stack_fffffffffffffc20,
                   (Bend **)in_stack_fffffffffffffc18,(BendDataSet *)0x311259);
        pVar10 = std::
                 map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                 ::insert((map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                           *)in_stack_fffffffffffffc30,(value_type *)in_stack_fffffffffffffc28);
        local_150 = (_Base_ptr)pVar10.first._M_node;
        local_148 = pVar10.second;
      }
      else {
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x31128f);
        RVar9 = (ppVar6->second).curr.angle;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x3112aa);
        (ppVar6->second).prev.angle = RVar9;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x3112c5);
        RVar9 = (ppVar6->second).curr.potential;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x3112e0);
        RVar3 = local_d0;
        (ppVar6->second).prev.potential = RVar9;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x31130d);
        RVar9 = local_d8;
        (ppVar6->second).curr.angle = RVar3;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x31133a);
        (ppVar6->second).curr.potential = RVar9;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x311355);
        dVar1 = (ppVar6->second).curr.potential;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x311370);
        dVar2 = (ppVar6->second).prev.potential;
        ppVar6 = std::_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>
                             *)0x31139f);
        (ppVar6->second).deltaV = ABS(dVar1 - dVar2);
      }
      if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
        in_stack_fffffffffffffd00 = (Bond *)(in_RDI + 0x248);
        Bend::getAtomA((Bend *)0x3113e5);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        if (!bVar4) {
          in_stack_fffffffffffffcf8 = in_RDI + 0x248;
          Bend::getAtomB((Bend *)0x31141c);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          if (!bVar4) {
            Bend::getAtomC((Bend *)0x311453);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            if (!bVar4) goto LAB_003114a4;
          }
        }
        RVar9 = Bend::getPotential(local_28);
        pdVar5 = Vector<double,_7U>::operator[](&local_c0,6);
        *pdVar5 = RVar9 + *pdVar5;
      }
LAB_003114a4:
      local_28 = Molecule::nextBend((Molecule *)in_stack_fffffffffffffc40,
                                    (iterator *)in_stack_fffffffffffffc38);
    }
    local_30 = Molecule::beginTorsion
                         ((Molecule *)in_stack_fffffffffffffc40,
                          (iterator *)in_stack_fffffffffffffc38);
    while (local_30 != (Torsion *)0x0) {
      (*(local_30->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (local_30,&local_158,(ulong)*(byte *)(in_RDI + 9) & 1);
      local_160 = Torsion::getPotential(local_30);
      RVar9 = Torsion::getPotential(local_30);
      local_80 = RVar9 + local_80;
      local_168._M_node =
           (_Base_ptr)
           std::
           map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
           ::find((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                   *)in_stack_fffffffffffffc18,(key_type *)0x31156c);
      local_170._M_node =
           (_Base_ptr)
           std::
           map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
           ::end((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                  *)in_stack_fffffffffffffc18);
      bVar4 = std::operator==(&local_168,&local_170);
      if (bVar4) {
        local_180 = local_158;
        local_190 = local_158;
        local_178 = local_160;
        local_188 = local_160;
        local_198 = 0;
        std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>::
        pair<OpenMD::Torsion_*&,_OpenMD::TorsionDataSet_&,_true>
                  ((pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)in_stack_fffffffffffffc20
                   ,(Torsion **)in_stack_fffffffffffffc18,(TorsionDataSet *)0x311623);
        pVar11 = std::
                 map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                 ::insert((map<OpenMD::Torsion_*,_OpenMD::TorsionDataSet,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                           *)in_stack_fffffffffffffc30,(value_type *)in_stack_fffffffffffffc28);
        local_1d8 = (_Base_ptr)pVar11.first._M_node;
        local_1d0 = pVar11.second;
      }
      else {
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x311659);
        RVar9 = (ppVar7->second).curr.angle;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x311674);
        (ppVar7->second).prev.angle = RVar9;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x31168f);
        RVar9 = (ppVar7->second).curr.potential;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x3116aa);
        RVar3 = local_158;
        (ppVar7->second).prev.potential = RVar9;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x3116d7);
        RVar9 = local_160;
        (ppVar7->second).curr.angle = RVar3;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x311704);
        (ppVar7->second).curr.potential = RVar9;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x31171f);
        dVar1 = (ppVar7->second).curr.potential;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x31173a);
        dVar2 = (ppVar7->second).prev.potential;
        ppVar7 = std::_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                 ::operator->((_Rb_tree_iterator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>
                               *)0x311769);
        (ppVar7->second).deltaV = ABS(dVar1 - dVar2);
      }
      if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
        Torsion::getAtomA((Torsion *)0x3117af);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        if (!bVar4) {
          Torsion::getAtomB((Torsion *)0x3117ea);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          if (!bVar4) {
            Torsion::getAtomC((Torsion *)0x311821);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            if (!bVar4) {
              Torsion::getAtomD((Torsion *)0x311855);
              bVar4 = SelectionManager::isSelected
                                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
              if (!bVar4) goto LAB_0031189d;
            }
          }
        }
        RVar9 = Torsion::getPotential(local_30);
        pdVar5 = Vector<double,_7U>::operator[](&local_c0,6);
        *pdVar5 = RVar9 + *pdVar5;
      }
LAB_0031189d:
      local_30 = Molecule::nextTorsion
                           ((Molecule *)in_stack_fffffffffffffc40,
                            (iterator *)in_stack_fffffffffffffc38);
    }
    local_38 = Molecule::beginInversion
                         ((Molecule *)in_stack_fffffffffffffc40,
                          (iterator *)in_stack_fffffffffffffc38);
    while (local_38 != (Inversion *)0x0) {
      (*(local_38->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (local_38,&local_1e0,(ulong)*(byte *)(in_RDI + 9) & 1);
      local_1e8 = Inversion::getPotential(local_38);
      RVar9 = Inversion::getPotential(local_38);
      local_88 = RVar9 + local_88;
      local_1f0._M_node =
           (_Base_ptr)
           std::
           map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
           ::find((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                   *)in_stack_fffffffffffffc18,(key_type *)0x311965);
      local_1f8._M_node =
           (_Base_ptr)
           std::
           map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
           ::end((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                  *)in_stack_fffffffffffffc18);
      bVar4 = std::operator==(&local_1f0,&local_1f8);
      if (bVar4) {
        std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>::
        pair<OpenMD::Inversion_*&,_OpenMD::InversionDataSet_&,_true>
                  ((pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> *)
                   in_stack_fffffffffffffc20,(Inversion **)in_stack_fffffffffffffc18,
                   (InversionDataSet *)0x311a19);
        std::
        map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
        ::insert((map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                  *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      }
      else {
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311a4c);
        RVar9 = (ppVar8->second).curr.angle;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311a64);
        (ppVar8->second).prev.angle = RVar9;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311a7c);
        RVar9 = (ppVar8->second).curr.potential;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311a94);
        RVar3 = local_1e0;
        (ppVar8->second).prev.potential = RVar9;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311abb);
        RVar9 = local_1e8;
        (ppVar8->second).curr.angle = RVar3;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311ae2);
        (ppVar8->second).curr.potential = RVar9;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311afa);
        dVar1 = (ppVar8->second).curr.potential;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311b12);
        dVar2 = (ppVar8->second).prev.potential;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>::
                 operator->((_Rb_tree_iterator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>
                             *)0x311b3b);
        (ppVar8->second).deltaV = ABS(dVar1 - dVar2);
      }
      if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
        Inversion::getAtomA((Inversion *)0x311b7b);
        bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        if (!bVar4) {
          in_stack_fffffffffffffc40 = (SimInfo *)(in_RDI + 0x248);
          Inversion::getAtomB((Inversion *)0x311bb0);
          bVar4 = SelectionManager::isSelected(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          if (!bVar4) {
            in_stack_fffffffffffffc38 = (iterator *)(in_RDI + 0x248);
            Inversion::getAtomC((Inversion *)0x311be1);
            bVar4 = SelectionManager::isSelected
                              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            if (!bVar4) {
              in_stack_fffffffffffffc30 = (Vector<double,_7U> *)(in_RDI + 0x248);
              Inversion::getAtomD((Inversion *)0x311c12);
              bVar4 = SelectionManager::isSelected
                                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
              if (!bVar4) goto LAB_00311c5a;
            }
          }
        }
        in_stack_fffffffffffffc28 = (value_type *)Inversion::getPotential(local_38);
        pdVar5 = Vector<double,_7U>::operator[](&local_c0,6);
        *pdVar5 = (double)in_stack_fffffffffffffc28 + *pdVar5;
      }
LAB_00311c5a:
      local_38 = Molecule::nextInversion
                           ((Molecule *)in_stack_fffffffffffffc40,
                            (iterator *)in_stack_fffffffffffffc38);
    }
    local_10 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffc40,(MoleculeIterator *)in_stack_fffffffffffffc38);
  } while( true );
}

Assistant:

void ForceManager::shortRangeInteractions() {
    Molecule* mol;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;

    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // calculate short range interactions
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->calcForce(doParticlePot_);
        bondPotential += bond->getPotential();
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bond->getAtomA()) ||
              seleMan_.isSelected(bond->getAtomB())) {
            selectionPotential[BONDED_FAMILY] += bond->getPotential();
          }
        }
      }

      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        RealType angle;
        bend->calcForce(angle, doParticlePot_);
        RealType currBendPot = bend->getPotential();

        bendPotential += bend->getPotential();
        map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
        if (i == bendDataSets.end()) {
          BendDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currBendPot;
          dataSet.deltaV                                  = 0.0;
          bendDataSets.insert(
              map<Bend*, BendDataSet>::value_type(bend, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currBendPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bend->getAtomA()) ||
              seleMan_.isSelected(bend->getAtomB()) ||
              seleMan_.isSelected(bend->getAtomC())) {
            selectionPotential[BONDED_FAMILY] += bend->getPotential();
          }
        }
      }

      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        RealType angle;
        torsion->calcForce(angle, doParticlePot_);
        RealType currTorsionPot = torsion->getPotential();
        torsionPotential += torsion->getPotential();
        map<Torsion*, TorsionDataSet>::iterator i =
            torsionDataSets.find(torsion);
        if (i == torsionDataSets.end()) {
          TorsionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
          dataSet.deltaV                                  = 0.0;
          torsionDataSets.insert(
              map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currTorsionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(torsion->getAtomA()) ||
              seleMan_.isSelected(torsion->getAtomB()) ||
              seleMan_.isSelected(torsion->getAtomC()) ||
              seleMan_.isSelected(torsion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += torsion->getPotential();
          }
        }
      }

      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        RealType angle;
        inversion->calcForce(angle, doParticlePot_);
        RealType currInversionPot = inversion->getPotential();
        inversionPotential += inversion->getPotential();
        map<Inversion*, InversionDataSet>::iterator i =
            inversionDataSets.find(inversion);
        if (i == inversionDataSets.end()) {
          InversionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
          dataSet.deltaV                                  = 0.0;
          inversionDataSets.insert(
              map<Inversion*, InversionDataSet>::value_type(inversion,
                                                            dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currInversionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(inversion->getAtomA()) ||
              seleMan_.isSelected(inversion->getAtomB()) ||
              seleMan_.isSelected(inversion->getAtomC()) ||
              seleMan_.isSelected(inversion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += inversion->getPotential();
          }
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }